

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Tee * kj::newTee(Tee *__return_storage_ptr__,Own<kj::AsyncInputStream> *input,uint64_t limit)

{
  Own<kj::AsyncInputStream> *pOVar1;
  RefOrVoid<kj::(anonymous_namespace)::AsyncTee> object;
  Own<kj::(anonymous_namespace)::AsyncTee> *params;
  int local_94;
  Own<kj::(anonymous_namespace)::TeeBranch> local_90;
  undefined1 local_80 [8];
  Own<kj::AsyncInputStream> branch2;
  Own<kj::(anonymous_namespace)::AsyncTee> local_60;
  Own<kj::(anonymous_namespace)::TeeBranch> local_50;
  undefined1 local_40 [8];
  Own<kj::AsyncInputStream> branch1;
  Own<kj::(anonymous_namespace)::AsyncTee> impl;
  uint64_t limit_local;
  Own<kj::AsyncInputStream> *input_local;
  
  impl.ptr = (AsyncTee *)limit;
  pOVar1 = mv<kj::Own<kj::AsyncInputStream>>(input);
  refcounted<kj::(anonymous_namespace)::AsyncTee,kj::Own<kj::AsyncInputStream>,unsigned_long&>
            ((kj *)&branch1.ptr,pOVar1,(unsigned_long *)&impl.ptr);
  object = Own<kj::(anonymous_namespace)::AsyncTee>::operator*
                     ((Own<kj::(anonymous_namespace)::AsyncTee> *)&branch1.ptr);
  addRef<kj::(anonymous_namespace)::AsyncTee>((kj *)&local_60,object);
  branch2.ptr._0_4_ = 0;
  heap<kj::(anonymous_namespace)::TeeBranch,kj::Own<kj::(anonymous_namespace)::AsyncTee>,int>
            ((kj *)&local_50,&local_60,(int *)&branch2.ptr);
  Own<kj::AsyncInputStream>::Own<kj::(anonymous_namespace)::TeeBranch,void>
            ((Own<kj::AsyncInputStream> *)local_40,&local_50);
  Own<kj::(anonymous_namespace)::TeeBranch>::~Own(&local_50);
  Own<kj::(anonymous_namespace)::AsyncTee>::~Own(&local_60);
  params = mv<kj::Own<kj::(anonymous_namespace)::AsyncTee>>
                     ((Own<kj::(anonymous_namespace)::AsyncTee> *)&branch1.ptr);
  local_94 = 1;
  heap<kj::(anonymous_namespace)::TeeBranch,kj::Own<kj::(anonymous_namespace)::AsyncTee>,int>
            ((kj *)&local_90,params,&local_94);
  Own<kj::AsyncInputStream>::Own<kj::(anonymous_namespace)::TeeBranch,void>
            ((Own<kj::AsyncInputStream> *)local_80,&local_90);
  Own<kj::(anonymous_namespace)::TeeBranch>::~Own(&local_90);
  pOVar1 = mv<kj::Own<kj::AsyncInputStream>>((Own<kj::AsyncInputStream> *)local_40);
  Own<kj::AsyncInputStream>::Own(__return_storage_ptr__->branches,pOVar1);
  pOVar1 = mv<kj::Own<kj::AsyncInputStream>>((Own<kj::AsyncInputStream> *)local_80);
  Own<kj::AsyncInputStream>::Own(__return_storage_ptr__->branches + 1,pOVar1);
  Own<kj::AsyncInputStream>::~Own((Own<kj::AsyncInputStream> *)local_80);
  Own<kj::AsyncInputStream>::~Own((Own<kj::AsyncInputStream> *)local_40);
  Own<kj::(anonymous_namespace)::AsyncTee>::~Own
            ((Own<kj::(anonymous_namespace)::AsyncTee> *)&branch1.ptr);
  return __return_storage_ptr__;
}

Assistant:

Tee newTee(Own<AsyncInputStream> input, uint64_t limit) {
  auto impl = refcounted<AsyncTee>(mv(input), limit);
  Own<AsyncInputStream> branch1 = heap<TeeBranch>(addRef(*impl), 0);
  Own<AsyncInputStream> branch2 = heap<TeeBranch>(mv(impl), 1);
  return { { mv(branch1), mv(branch2) } };
}